

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O0

size_type __thiscall wabt::string_view::find(string_view *this,char *s,size_type pos)

{
  size_type sVar1;
  string_view local_30;
  size_type local_20;
  size_type pos_local;
  char *s_local;
  string_view *this_local;
  
  local_20 = pos;
  pos_local = (size_type)s;
  s_local = (char *)this;
  string_view(&local_30,s);
  sVar1 = find(this,local_30,local_20);
  return sVar1;
}

Assistant:

string_view::size_type string_view::find(const char* s, size_type pos) const {
  return find(string_view(s), pos);
}